

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O0

void __thiscall
common_arg::common_arg
          (common_arg *this,initializer_list<const_char_*> *args,char *value_hint,string *help,
          _func_void_common_params_ptr_string_ptr *handler)

{
  initializer_list<const_char_*> __l;
  initializer_list<llama_example> __l_00;
  string *in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  allocator_type *__a;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_ffffffffffffff90;
  iterator ppcVar1;
  allocator_type *in_stack_ffffffffffffffa0;
  size_type sVar2;
  less<llama_example> *in_stack_ffffffffffffffa8;
  set<llama_example,_std::less<llama_example>,_std::allocator<llama_example>_>
  *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8 [12];
  undefined4 uVar3;
  
  uVar3 = 0;
  __a = (allocator_type *)&stack0xffffffffffffffc2;
  std::allocator<llama_example>::allocator((allocator<llama_example> *)0x1aefbb);
  __l_00._M_len._4_4_ = uVar3;
  __l_00._0_12_ = in_stack_ffffffffffffffb8;
  std::set<llama_example,_std::less<llama_example>,_std::allocator<llama_example>_>::set
            (in_stack_ffffffffffffffb0,__l_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::allocator<llama_example>::~allocator((allocator<llama_example> *)0x1aefe5);
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  std::set<llama_example,_std::less<llama_example>,_std::allocator<llama_example>_>::set
            ((set<llama_example,_std::less<llama_example>,_std::allocator<llama_example>_> *)
             0x1af00a);
  ppcVar1 = (iterator)*in_RSI;
  sVar2 = in_RSI[1];
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x1af037);
  __l._M_len = sVar2;
  __l._M_array = ppcVar1;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (in_stack_ffffffffffffff90,__l,__a);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x1af05c);
  *(undefined8 *)(in_RDI + 0x78) = in_RDX;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  *(undefined8 *)(in_RDI + 0x88) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x90),in_RCX);
  *(undefined1 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = 0;
  *(undefined8 *)(in_RDI + 0xc0) = in_R8;
  *(undefined8 *)(in_RDI + 200) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  return;
}

Assistant:

common_arg(
        const std::initializer_list<const char *> & args,
        const char * value_hint,
        const std::string & help,
        void (*handler)(common_params & params, const std::string &)
    ) : args(args), value_hint(value_hint), help(help), handler_string(handler) {}